

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O3

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count,bool stereo)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  do {
    uVar2 = *(long *)(&this->field_0x18 + lVar1) * clock_count +
            *(long *)(&this->field_0x20 + lVar1);
    *(ulong *)(&this->field_0x20 + lVar1) = uVar2;
    if ((ulong)*(uint *)(&this->field_0x30 + lVar1) < uVar2 >> 0x10) {
      __assert_fail("( \"Blip_Buffer::end_frame(): Frame went past end of buffer\", samples_avail() <= (long) buffer_size_ )"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.h"
                    ,0xe6,"void Blip_Buffer::end_frame(blip_time_t)");
    }
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0xd8);
  this->stereo_added = (bool)(this->stereo_added | stereo);
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count, bool stereo )
{
	for ( unsigned i = 0; i < buf_count; i++ )
		bufs [i].end_frame( clock_count );
	
	stereo_added |= stereo;
}